

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmap.cpp
# Opt level: O0

void test4(void)

{
  GarbageCollectedBase *pGVar1;
  ostream *this;
  int local_3c;
  void *local_38;
  LinkedNode *local_30;
  LinkedNode *t2;
  LinkedNode *local_20;
  LinkedNode *t1;
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *pHStack_10;
  int id;
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *p;
  
  pHStack_10 = TinyGC::
               MakeGarbageCollected<HeapMap<LinkedNode,LinkedNode,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
                         (tg);
  for (t1._4_4_ = 0; t1._4_4_ < 10; t1._4_4_ = t1._4_4_ + 1) {
    t2 = (LinkedNode *)0x0;
    local_20 = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int&>
                         (tg,&t2,(int *)((long)&t1 + 4));
    local_38 = (void *)0x0;
    local_3c = t1._4_4_ + 100;
    local_30 = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int>
                         (tg,&local_38,&local_3c);
    HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
    ::insert(pHStack_10,local_20,local_30);
    pGVar1 = HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
             ::at(pHStack_10,local_20);
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pGVar1);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void test4() {
  HeapMap<LinkedNode, LinkedNode> *p =
      MakeGarbageCollected<HeapMap<LinkedNode, LinkedNode>>();
  for (int id = 0; id < 10; id++) {
    auto t1 = MakeGarbageCollected<LinkedNode>(nullptr, id);
    auto t2 = MakeGarbageCollected<LinkedNode>(nullptr, id + 100);

    p->insert(t1, t2);
    // p->erase(t1);
    std::cout << p->at(t1) << std::endl;
  }
}